

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__start_callbacks(stbi__context *s,stbi_io_callbacks *c,void *user)

{
  _func_void_void_ptr_int *p_Var1;
  
  (s->io).eof = c->eof;
  p_Var1 = c->skip;
  (s->io).read = c->read;
  (s->io).skip = p_Var1;
  s->io_user_data = user;
  s->read_from_callbacks = 1;
  s->buflen = 0x80;
  s->img_buffer_original = s->buffer_start;
  stbi__refill_buffer(s);
  return;
}

Assistant:

static void stbi__start_callbacks(stbi__context *s, stbi_io_callbacks *c, void *user)
{
   s->io = *c;
   s->io_user_data = user;
   s->buflen = sizeof(s->buffer_start);
   s->read_from_callbacks = 1;
   s->img_buffer_original = s->buffer_start;
   stbi__refill_buffer(s);
}